

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O0

void assessQpPrimalFeasibility
               (Instance *instance,double primal_feasibility_tolerance,
               vector<double,_std::allocator<double>_> *var_value,
               vector<double,_std::allocator<double>_> *con_value,HighsInt *num_var_infeasibilities,
               double *max_var_infeasibility,double *sum_var_infeasibilities,
               HighsInt *num_con_infeasibilities,double *max_con_infeasibility,
               double *sum_con_infeasibilities,double *max_con_residual,double *sum_con_residuals)

{
  int iVar1;
  const_reference pvVar2;
  double *pdVar3;
  const_reference pvVar4;
  reference this;
  int *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar5;
  int *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  double *in_stack_00000028;
  double con_residual;
  double con_infeasibility;
  double primal_1;
  double upper_1;
  double lower_1;
  HighsInt iCon;
  HighsInt iEl;
  double var_infeasibility;
  double primal;
  double upper;
  double lower;
  HighsInt iVar;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> con_value_quad;
  size_type in_stack_fffffffffffffef8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffff00;
  double dVar6;
  double in_stack_ffffffffffffff08;
  HighsCDouble *in_stack_ffffffffffffff10;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  value_type local_a0;
  int local_98;
  int local_94;
  double local_90;
  double local_88;
  double local_80;
  value_type local_78;
  int local_70;
  HighsCDouble local_60;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_50;
  double *local_38;
  double *local_30;
  int *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  double local_10;
  long local_8;
  
  *in_RCX = 0;
  *in_R8 = 0.0;
  *in_R9 = 0.0;
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0.0;
  *in_stack_00000018 = 0.0;
  *in_stack_00000020 = 0.0;
  *in_stack_00000028 = 0.0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x74bccb);
  HighsCDouble::HighsCDouble(&local_60,0.0);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::assign
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(value_type *)0x74bd08);
  for (local_70 = 0; local_70 < *(int *)(local_8 + 4); local_70 = local_70 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1d0),(long)local_70)
    ;
    local_78 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1e8),(long)local_70)
    ;
    local_80 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_70);
    local_88 = *pvVar2;
    local_90 = 0.0;
    if (local_78 - local_10 <= local_88) {
      if (local_80 + local_10 < local_88) {
        local_90 = local_88 - local_80;
      }
    }
    else {
      local_90 = local_78 - local_88;
    }
    if (0.0 < local_90) {
      if (local_10 < local_90) {
        *local_28 = *local_28 + 1;
      }
      pdVar3 = std::max<double>(&local_90,local_30);
      *local_30 = *pdVar3;
      *local_38 = local_90 + *local_38;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_8 + 0x188),(long)local_70);
    for (local_94 = *pvVar4; iVar1 = local_94,
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_8 + 0x188),
                            (long)(local_70 + 1)), iVar1 < *pvVar4; local_94 = local_94 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_8 + 0x1b8),(long)local_94);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 0x1a0),(long)local_94);
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](&local_50,(long)*pvVar4);
      HighsCDouble::operator+=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
  }
  for (local_98 = 0; local_98 < *(int *)(local_8 + 8); local_98 = local_98 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_8 + 0xf8),(long)local_98);
    local_a0 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_8 + 0x110),(long)local_98)
    ;
    local_a8 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_98);
    local_b0 = *pvVar2;
    local_b8 = 0.0;
    if (local_a0 - local_10 <= local_b0) {
      if (local_a8 + local_10 < local_b0) {
        local_b8 = local_b0 - local_a8;
      }
    }
    else {
      local_b8 = local_a0 - local_b0;
    }
    if (0.0 < local_b8) {
      if (local_10 < local_b8) {
        *in_stack_00000008 = *in_stack_00000008 + 1;
      }
      in_stack_ffffffffffffff10 = (HighsCDouble *)std::max<double>(&local_b8,in_stack_00000010);
      *in_stack_00000010 = in_stack_ffffffffffffff10->hi;
      *in_stack_00000018 = local_b8 + *in_stack_00000018;
    }
    dVar6 = local_b0;
    this = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                     (&local_50,(long)local_98);
    dVar5 = HighsCDouble::operator_cast_to_double(this);
    local_c0 = ABS(dVar6 - dVar5);
    pdVar3 = std::max<double>(&local_c0,in_stack_00000020);
    *in_stack_00000020 = *pdVar3;
    *in_stack_00000028 = local_c0 + *in_stack_00000028;
  }
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void assessQpPrimalFeasibility(
    const Instance& instance, const double primal_feasibility_tolerance,
    const std::vector<double>& var_value, const std::vector<double>& con_value,
    HighsInt& num_var_infeasibilities, double& max_var_infeasibility,
    double& sum_var_infeasibilities, HighsInt& num_con_infeasibilities,
    double& max_con_infeasibility, double& sum_con_infeasibilities,
    double& max_con_residual, double& sum_con_residuals) {
  num_var_infeasibilities = 0;
  max_var_infeasibility = 0;
  sum_var_infeasibilities = 0;
  num_con_infeasibilities = 0;
  max_con_infeasibility = 0;
  sum_con_infeasibilities = 0;
  max_con_residual = 0;
  sum_con_residuals = 0;
  // Valid solution, but is it feasible?
  std::vector<HighsCDouble> con_value_quad;
  con_value_quad.assign(instance.num_con, HighsCDouble{0.0});
  for (HighsInt iVar = 0; iVar < instance.num_var; iVar++) {
    double lower = instance.var_lo[iVar];
    double upper = instance.var_up[iVar];
    double primal = var_value[iVar];
    double var_infeasibility = 0;
    if (primal < lower - primal_feasibility_tolerance) {
      var_infeasibility = lower - primal;
    } else if (primal > upper + primal_feasibility_tolerance) {
      var_infeasibility = primal - upper;
    }
    if (var_infeasibility > 0) {
      if (var_infeasibility > primal_feasibility_tolerance)
        num_var_infeasibilities++;
      max_var_infeasibility =
          std::max(var_infeasibility, max_var_infeasibility);
      sum_var_infeasibilities += var_infeasibility;
    }
    for (HighsInt iEl = instance.A.mat.start[iVar];
         iEl < instance.A.mat.start[iVar + 1]; iEl++) {
      con_value_quad[instance.A.mat.index[iEl]] +=
          primal * instance.A.mat.value[iEl];
    }
  }
  for (HighsInt iCon = 0; iCon < instance.num_con; iCon++) {
    double lower = instance.con_lo[iCon];
    double upper = instance.con_up[iCon];
    double primal = con_value[iCon];
    double con_infeasibility = 0;
    if (primal < lower - primal_feasibility_tolerance) {
      con_infeasibility = lower - primal;
    } else if (primal > upper + primal_feasibility_tolerance) {
      con_infeasibility = primal - upper;
    }
    if (con_infeasibility > 0) {
      if (con_infeasibility > primal_feasibility_tolerance)
        num_con_infeasibilities++;
      max_con_infeasibility =
          std::max(con_infeasibility, max_con_infeasibility);
      sum_con_infeasibilities += con_infeasibility;
    }
    double con_residual = std::fabs(primal - double(con_value_quad[iCon]));
    max_con_residual = std::max(con_residual, max_con_residual);
    sum_con_residuals += con_residual;
  }
}